

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ClosePopupsOverWindow(ImGuiWindow *ref_window,bool restore_focus_to_window_under_popup)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiPopupData *pIVar3;
  long in_RDI;
  ImGuiWindow *popup_window;
  int m;
  bool popup_or_descendent_is_ref_window;
  ImGuiPopupData *popup;
  int popup_count_to_keep;
  ImGuiContext *g;
  int in_stack_ffffffffffffffbc;
  undefined7 in_stack_ffffffffffffffc0;
  byte in_stack_ffffffffffffffc7;
  int in_stack_ffffffffffffffd0;
  undefined1 restore_focus_to_window_under_popup_00;
  uint in_stack_ffffffffffffffd4;
  int local_1c;
  
  pIVar1 = GImGui;
  bVar2 = ImVector<ImGuiPopupData>::empty(&GImGui->OpenPopupStack);
  restore_focus_to_window_under_popup_00 = (undefined1)((uint)in_stack_ffffffffffffffd0 >> 0x18);
  if (!bVar2) {
    local_1c = 0;
    if (in_RDI != 0) {
      for (; local_1c < (pIVar1->OpenPopupStack).Size; local_1c = local_1c + 1) {
        pIVar3 = ImVector<ImGuiPopupData>::operator[]
                           ((ImVector<ImGuiPopupData> *)
                            CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffbc);
        if (pIVar3->Window != (ImGuiWindow *)0x0) {
          if ((pIVar3->Window->Flags & 0x4000000U) == 0) {
            __assert_fail("(popup.Window->Flags & ImGuiWindowFlags_Popup) != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                          ,0x1dff,"void ImGui::ClosePopupsOverWindow(ImGuiWindow *, bool)");
          }
          if ((pIVar3->Window->Flags & 0x1000000U) == 0) {
            in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 & 0xffffff;
            in_stack_ffffffffffffffd0 = local_1c;
            while( true ) {
              in_stack_ffffffffffffffc7 = 0;
              if (in_stack_ffffffffffffffd0 < (pIVar1->OpenPopupStack).Size) {
                in_stack_ffffffffffffffc7 = (byte)(in_stack_ffffffffffffffd4 >> 0x18) ^ 0xff;
              }
              if ((in_stack_ffffffffffffffc7 & 1) == 0) break;
              pIVar3 = ImVector<ImGuiPopupData>::operator[]
                                 ((ImVector<ImGuiPopupData> *)
                                  CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                                  in_stack_ffffffffffffffbc);
              if ((pIVar3->Window != (ImGuiWindow *)0x0) &&
                 (pIVar3->Window->RootWindow == *(ImGuiWindow **)(in_RDI + 0x368))) {
                in_stack_ffffffffffffffd4 = CONCAT13(1,(int3)in_stack_ffffffffffffffd4);
              }
              in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 + 1;
            }
            if ((in_stack_ffffffffffffffd4 & 0x1000000) == 0) break;
          }
        }
      }
      restore_focus_to_window_under_popup_00 = (undefined1)((uint)in_stack_ffffffffffffffd0 >> 0x18)
      ;
    }
    if (local_1c < (pIVar1->OpenPopupStack).Size) {
      ClosePopupToLevel(in_stack_ffffffffffffffd4,(bool)restore_focus_to_window_under_popup_00);
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupsOverWindow(ImGuiWindow* ref_window, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.empty())
        return;

    // When popups are stacked, clicking on a lower level popups puts focus back to it and close popups above it.
    // Don't close our own child popup windows.
    int popup_count_to_keep = 0;
    if (ref_window)
    {
        // Find the highest popup which is a descendant of the reference window (generally reference window = NavWindow)
        for (; popup_count_to_keep < g.OpenPopupStack.Size; popup_count_to_keep++)
        {
            ImGuiPopupData& popup = g.OpenPopupStack[popup_count_to_keep];
            if (!popup.Window)
                continue;
            IM_ASSERT((popup.Window->Flags & ImGuiWindowFlags_Popup) != 0);
            if (popup.Window->Flags & ImGuiWindowFlags_ChildWindow)
                continue;

            // Trim the stack when popups are not direct descendant of the reference window (the reference window is often the NavWindow)
            bool popup_or_descendent_is_ref_window = false;
            for (int m = popup_count_to_keep; m < g.OpenPopupStack.Size && !popup_or_descendent_is_ref_window; m++)
                if (ImGuiWindow* popup_window = g.OpenPopupStack[m].Window)
                    if (popup_window->RootWindow == ref_window->RootWindow)
                        popup_or_descendent_is_ref_window = true;
            if (!popup_or_descendent_is_ref_window)
                break;
        }
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
    {
        //IMGUI_DEBUG_LOG("ClosePopupsOverWindow(%s) -> ClosePopupToLevel(%d)\n", ref_window->Name, popup_count_to_keep);
        ClosePopupToLevel(popup_count_to_keep, restore_focus_to_window_under_popup);
    }
}